

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O1

int __thiscall
x86Argument::Decode(x86Argument *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize,bool x64,
                   bool useMmWord,bool skipSize)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *puVar8;
  CodeGenRegVmStateContext *pCVar9;
  undefined8 uVar10;
  ulong size;
  char *pcVar11;
  char *pcVar12;
  char *src;
  int iVar13;
  size_t sVar14;
  size_t sVar15;
  
  size = (ulong)bufSize;
  iVar13 = (int)buf;
  pcVar11 = buf;
  switch(this->type) {
  case argNumber:
    if (ctx->vsAsmStyle != true) {
      pCVar9 = (CodeGenRegVmStateContext *)(long)(this->field_1).num;
      if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->callInstructionPos) {
        pcVar11 = "&ctx.callInstructionPos";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->dataStackTop) {
        pcVar11 = "&ctx.dataStackTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->callStackTop) {
        pcVar11 = "&ctx.callStackTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->regFileLastTop) {
        pcVar11 = "&ctx.regFileLastTop";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->regFileLastPtr) {
        pcVar11 = "&ctx.regFileLastPtr";
      }
      else if (pCVar9 == (CodeGenRegVmStateContext *)ctx->dataStackBase) {
        pcVar11 = "ctx.dataStackBase";
      }
      else {
        if (pCVar9 != (CodeGenRegVmStateContext *)ctx->ctx->exRegVmConstants) {
          if (pCVar9 == ctx) goto LAB_00269ae8;
          pcVar11 = "%d";
          goto LAB_00269ad3;
        }
        pcVar11 = "ctx.exRegVmConstants";
      }
      goto LAB_00269f07;
    }
    pcVar11 = "";
    if (9 < (this->field_1).num) {
      pcVar11 = "h";
    }
    iVar6 = NULLC::SafeSprintf(buf,size,"%x%s",(ulong)(uint)(this->field_1).num,pcVar11);
    break;
  case argReg:
    puVar8 = (anonymous_namespace)::x86RegText;
    if (x64) {
      puVar8 = (anonymous_namespace)::x64RegText;
    }
    pcVar11 = *(char **)(puVar8 + (ulong)(this->field_1).reg * 8);
    goto LAB_00269aa5;
  case argXmmReg:
    pcVar11 = _ZN12_GLOBAL__N_113x86XmmRegTextE_rel +
              *(int *)(_ZN12_GLOBAL__N_113x86XmmRegTextE_rel + (ulong)(this->field_1).reg * 4);
LAB_00269aa5:
    strcpy(buf,pcVar11);
    sVar15 = strlen(buf);
    goto LAB_00269f1c;
  case argPtr:
    if (!skipSize) {
      puVar8 = (anonymous_namespace)::x86SizeText;
      if (useMmWord) {
        puVar8 = (anonymous_namespace)::x86XmmSizeText;
      }
      strcpy(buf,*(char **)(puVar8 + (ulong)(this->field_1).reg * 8));
      sVar15 = strlen(buf);
      pcVar11 = buf + sVar15;
      if (ctx->vsAsmStyle == true) {
        builtin_strncpy(buf + sVar15," ptr",4);
        pcVar11 = pcVar11 + 4;
      }
      *pcVar11 = ' ';
      pcVar11 = pcVar11 + 1;
    }
    pcVar11[0] = '[';
    pcVar11[1] = '\0';
    pcVar11 = pcVar11 + 1;
    if (ctx->vsAsmStyle == false) {
      if ((ulong)this->ptrIndex != 0) {
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar11,*(char **)(puVar8 + (ulong)this->ptrIndex * 8));
        sVar15 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar15;
      }
      if (1 < this->ptrMult) {
        iVar6 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar13 - (int)pcVar11) + bufSize),"*%d");
        pcVar11 = pcVar11 + iVar6;
      }
    }
    uVar7 = (ulong)this->ptrBase;
    if (uVar7 != 0) {
      if (ctx->vsAsmStyle == true) {
        sVar14 = (size_t)((iVar13 - (int)pcVar11) + bufSize);
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        uVar10 = *(undefined8 *)(puVar8 + uVar7 * 8);
LAB_00269b62:
        pcVar12 = "%s";
      }
      else {
        sVar14 = (size_t)((iVar13 - (int)pcVar11) + bufSize);
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        uVar10 = *(undefined8 *)(puVar8 + uVar7 * 8);
        if (this->ptrIndex == rNONE) goto LAB_00269b62;
        pcVar12 = " + %s";
      }
      iVar6 = NULLC::SafeSprintf(pcVar11,sVar14,pcVar12,uVar10);
      pcVar11 = pcVar11 + iVar6;
    }
    if (ctx->vsAsmStyle == true) {
      if (this->ptrIndex != rNONE) {
        if (this->ptrBase != rNONE) {
          *pcVar11 = '+';
          pcVar11 = pcVar11 + 1;
        }
        puVar8 = (anonymous_namespace)::x86RegText;
        if (x64) {
          puVar8 = (anonymous_namespace)::x64RegText;
        }
        strcpy(pcVar11,*(char **)(puVar8 + (ulong)this->ptrIndex * 8));
        sVar15 = strlen(pcVar11);
        pcVar11 = pcVar11 + sVar15;
      }
      if (1 < this->ptrMult) {
        iVar6 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar13 - (int)pcVar11) + bufSize),"*%d");
        pcVar11 = pcVar11 + iVar6;
      }
    }
    bVar4 = this->ptrBase != rNONE;
    bVar5 = this->ptrIndex != rNONE;
    iVar6 = (int)pcVar11;
    if (bVar4 || bVar5) goto LAB_00269da8;
    if (ctx->vsAsmStyle == true) {
      uVar7 = (ulong)(uint)this->ptrNum;
      pcVar12 = "";
      if (9 < this->ptrNum) {
        pcVar12 = "h";
      }
      src = "%x%s";
LAB_00269c31:
      iVar6 = NULLC::SafeSprintf(pcVar11,(ulong)((iVar13 - iVar6) + bufSize),src,uVar7,pcVar12);
LAB_00269fd9:
      pcVar11 = pcVar11 + iVar6;
    }
    else {
      if (!bVar4 && !bVar5) {
        iVar1 = this->ptrNum;
        if (((uint *)(long)iVar1 < ctx->tempStackArrayBase) ||
           (ctx->tempStackArrayEnd <= (uint *)(long)iVar1)) {
          if (!bVar4 && !bVar5) {
            iVar1 = this->ptrNum;
            if ((ctx->dataStackBase <= (char *)(long)iVar1) &&
               ((char *)(long)iVar1 < ctx->dataStackEnd)) {
              sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
              uVar7 = (ulong)(uint)(iVar1 - (int)ctx->dataStackBase);
              pcVar12 = "globals+%u";
              goto LAB_00269c7d;
            }
            if (!bVar4 && !bVar5) {
              iVar1 = this->ptrNum;
              puVar3 = ctx->ctx->exRegVmConstants;
              if ((puVar3 <= (uint *)(long)iVar1) &&
                 ((uint *)(long)iVar1 < ctx->ctx->exRegVmConstantsEnd)) {
                sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
                uVar7 = (ulong)(uint)(iVar1 - (int)puVar3);
                pcVar12 = "constants+%u";
                goto LAB_00269c7d;
              }
            }
          }
          goto LAB_00269da8;
        }
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        uVar7 = (ulong)(uint)(iVar1 - (int)ctx->tempStackArrayBase);
        pcVar12 = "temp+%u";
        goto LAB_00269c7d;
      }
LAB_00269da8:
      uVar2 = this->ptrNum;
      uVar7 = (ulong)uVar2;
      puVar8 = (undefined1 *)(long)(int)uVar2;
      if ((uint *)puVar8 == &ctx->callInstructionPos && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.callInstructionPos";
LAB_00269fcf:
        iVar6 = NULLC::SafeSprintf(pcVar11,sVar14,pcVar12);
        goto LAB_00269fd9;
      }
      if ((char **)puVar8 == &ctx->dataStackTop && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.dataStackTop";
        goto LAB_00269fcf;
      }
      if ((CodeGenRegVmCallStackEntry **)puVar8 == &ctx->callStackTop && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.callStackTop";
        goto LAB_00269fcf;
      }
      if ((RegVmRegister **)puVar8 == &ctx->regFileLastTop && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.regFileLastTop";
        goto LAB_00269fcf;
      }
      if ((RegVmRegister **)puVar8 == &ctx->regFileLastPtr && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.regFileLastPtr";
        goto LAB_00269fcf;
      }
      if ((_func_void_CodeGenRegVmStateContext_ptr_uint **)puVar8 == &ctx->callWrap &&
          (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.callWrap";
        goto LAB_00269fcf;
      }
      if ((_func_void_CodeGenRegVmStateContext_ptr_uintptr_t_uint **)puVar8 ==
          &ctx->checkedReturnWrap && (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.checkedReturnWrap";
        goto LAB_00269fcf;
      }
      if ((_func_void_CodeGenRegVmStateContext_ptr_uint_uint **)puVar8 == &ctx->convertPtrWrap &&
          (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.convertPtrWrap";
        goto LAB_00269fcf;
      }
      if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar8 == &ctx->errorOutOfBoundsWrap &&
          (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.errorOutOfBoundsWrap";
        goto LAB_00269fcf;
      }
      if ((_func_void_CodeGenRegVmStateContext_ptr **)puVar8 == &ctx->errorNoReturnWrap &&
          (!bVar4 && !bVar5)) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "&ctx.errorNoReturnWrap";
        goto LAB_00269fcf;
      }
      if (!bVar4 && !bVar5) {
        sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
        pcVar12 = "%d";
LAB_00269c7d:
        iVar6 = NULLC::SafeSprintf(pcVar11,sVar14,pcVar12,uVar7);
        goto LAB_00269fd9;
      }
      if (uVar2 != 0) {
        if (ctx->vsAsmStyle == true) {
          pcVar12 = "";
          if (9 < (int)uVar2) {
            pcVar12 = "h";
          }
          src = "+%x%s";
          goto LAB_00269c31;
        }
        if (uVar2 != 0) {
          sVar14 = (size_t)((iVar13 - iVar6) + bufSize);
          pcVar12 = "%+d";
          goto LAB_00269c7d;
        }
      }
    }
    pcVar11[0] = ']';
    pcVar11[1] = '\0';
    pcVar11 = pcVar11 + 1;
    goto switchD_00269901_default;
  case argPtrLabel:
    iVar6 = NULLC::SafeSprintf(buf,size,"[\'0x%x\'+%d]",(ulong)(this->field_1).reg,
                               (ulong)(uint)this->ptrNum);
    break;
  case argLabel:
    pCVar9 = (CodeGenRegVmStateContext *)(ulong)(this->field_1).reg;
    pcVar11 = "\'0x%x\'";
LAB_00269ad3:
    iVar6 = NULLC::SafeSprintf(buf,size,pcVar11,pCVar9);
    break;
  case argImm64:
    pCVar9 = (CodeGenRegVmStateContext *)(this->field_1).imm64Arg;
    if (pCVar9 == ctx) {
LAB_00269ae8:
      pcVar11 = "&ctx";
    }
    else if (pCVar9 == (CodeGenRegVmStateContext *)&ctx->tempStackArrayBase) {
      pcVar11 = "&ctx.tempStackArrayBase";
    }
    else {
      if (pCVar9 != (CodeGenRegVmStateContext *)ctx->tempStackArrayBase) {
        if (ctx->vsAsmStyle == true) {
          pcVar11 = "%llXh";
        }
        else {
          pcVar11 = "%lld";
        }
        iVar6 = NULLC::SafeSprintf(buf,size,pcVar11);
        break;
      }
      pcVar11 = "ctx.tempStackArrayBase";
    }
LAB_00269f07:
    iVar6 = NULLC::SafeSprintf(buf,size,pcVar11);
    break;
  default:
    goto switchD_00269901_default;
  }
  sVar15 = (size_t)iVar6;
LAB_00269f1c:
  pcVar11 = buf + sVar15;
switchD_00269901_default:
  if (pcVar11 < buf + size) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0xd2,
                  "int x86Argument::Decode(CodeGenRegVmStateContext &, char *, unsigned int, bool, bool, bool)"
                 );
  }
  return (int)pcVar11 - iVar13;
}

Assistant:

int x86Argument::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize, bool x64, bool useMmWord, bool skipSize)
{
	char *curr = buf;

	if(type == argNumber)
	{
		if(ctx.vsAsmStyle)
		{
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", num, num > 9 ? "h" : "");
		}
		else
		{
			if(uintptr_t(num) == uintptr_t(&ctx.callInstructionPos))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
			else if(uintptr_t(num) == uintptr_t(&ctx.dataStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.callStackTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastTop))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
			else if(uintptr_t(num) == uintptr_t(&ctx.regFileLastPtr))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
			else if(uintptr_t(num) == uintptr_t(ctx.dataStackBase))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.dataStackBase");
			else if(uintptr_t(num) == uintptr_t(ctx.ctx->exRegVmConstants))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.exRegVmConstants");
			else if(uintptr_t(num) == uintptr_t(&ctx))
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", num);
		}
	}
	else if(type == argReg)
	{
		strcpy(curr, (x64 ? x64RegText : x86RegText)[reg]);
		curr += strlen(curr);
	}
	else if(type == argXmmReg)
	{
		strcpy(curr, x86XmmRegText[xmmArg]);
		curr += strlen(curr);
	}
	else if(type == argLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "'0x%x'", labelID);
	}
	else if(type == argPtrLabel)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "['0x%x'+%d]", labelID, ptrNum);
	}
	else if(type == argPtr)
	{
		if(!skipSize)
		{
			strcpy(curr, (useMmWord ? x86XmmSizeText : x86SizeText)[ptrSize]);
			curr += strlen(curr);

			if(ctx.vsAsmStyle)
			{
				*curr++ = ' ';
				*curr++ = 'p';
				*curr++ = 't';
				*curr++ = 'r';
			}

			*curr++ = ' ';
		}

		*curr++ = '[';
		*curr = 0;

		if(!ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrBase != rNONE)
		{
			if(ctx.vsAsmStyle)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else if(ptrIndex != rNONE)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), " + %s", (x64 ? x64RegText : x86RegText)[ptrBase]);
			else
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%s", (x64 ? x64RegText : x86RegText)[ptrBase]);
		}

		if(ctx.vsAsmStyle)
		{
			if(ptrIndex != rNONE)
			{
				if(ptrBase != rNONE)
					*curr++ = '+';

				strcpy(curr, (x64 ? x64RegText : x86RegText)[ptrIndex]);
				curr += strlen(curr);
			}

			if(ptrMult > 1)
				curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "*%d", ptrMult);
		}

		if(ptrIndex == rNONE && ptrBase == rNONE && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.tempStackArrayBase) && uintptr_t(ptrNum) < uintptr_t(ctx.tempStackArrayEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "temp+%u", unsigned(ptrNum - uintptr_t(ctx.tempStackArrayBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.dataStackBase) && uintptr_t(ptrNum) < uintptr_t(ctx.dataStackEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "globals+%u", unsigned(ptrNum - uintptr_t(ctx.dataStackBase)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) >= uintptr_t(ctx.ctx->exRegVmConstants) && uintptr_t(ptrNum) < uintptr_t(ctx.ctx->exRegVmConstantsEnd))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "constants+%u", unsigned(ptrNum - uintptr_t(ctx.ctx->exRegVmConstants)));
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callInstructionPos))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callInstructionPos");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.dataStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.dataStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callStackTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callStackTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastTop))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastTop");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.regFileLastPtr))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.regFileLastPtr");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.callWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.callWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.checkedReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.checkedReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.convertPtrWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.convertPtrWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorOutOfBoundsWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorOutOfBoundsWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE && uintptr_t(ptrNum) == uintptr_t(&ctx.errorNoReturnWrap))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.errorNoReturnWrap");
		else if(ptrIndex == rNONE && ptrBase == rNONE)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%d", ptrNum);
		else if(ptrNum != 0 && ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "+%x%s", ptrNum, ptrNum > 9 ? "h" : "");
		else if(ptrNum != 0)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%+d", ptrNum);

		*curr++ = ']';
		*curr = 0;
	}
	else if(type == argImm64)
	{
		if(imm64Arg == uintptr_t(&ctx))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx");
		else if(imm64Arg == uintptr_t(&ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "&ctx.tempStackArrayBase");
		else if(imm64Arg == uintptr_t(ctx.tempStackArrayBase))
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "ctx.tempStackArrayBase");
		else if(ctx.vsAsmStyle)
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%llXh", (unsigned long long)imm64Arg);
		else
			curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "%lld", (long long)imm64Arg);
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}